

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall
Preprocessor::preprocess(Preprocessor *this,QByteArray *filename,Symbols *preprocessed)

{
  stack<QByteArray,_QList<QByteArray>_> *this_00;
  qsizetype *index;
  char *pcVar1;
  byte bVar2;
  Token TVar3;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *this_01;
  Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *this_02;
  qsizetype qVar4;
  Data *pDVar5;
  undefined8 uVar6;
  Data *pDVar7;
  qsizetype qVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Node<QByteArray,_QHashDummyValue> *pNVar12;
  long lVar13;
  Token *pTVar14;
  Symbol *pSVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar16;
  char *pcVar17;
  qsizetype i;
  ulong uVar18;
  QString *this_03;
  QFile *pQVar19;
  long in_FS_OFFSET;
  bool bVar20;
  Bucket BVar21;
  QByteArrayView ba;
  Symbol sym;
  SubArray local_108;
  Macro local_d8;
  QArrayDataPointer<Symbol> local_a0;
  QArrayDataPointer<Symbol> local_88;
  QFile local_68;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_Parser).currentFilenames;
  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
            ((QMovableArrayOps<QByteArray> *)this_00,(this->super_Parser).currentFilenames.c.d.size,
             filename);
  QList<QByteArray>::end(&this_00->c);
  QList<Symbol>::reserve(preprocessed,(this->super_Parser).symbols.d.size + (preprocessed->d).size);
  lVar11 = (this->super_Parser).symbols.d.size;
  lVar13 = (this->super_Parser).index;
  if (lVar11 <= lVar13) {
LAB_00141643:
    std::stack<QByteArray,_QList<QByteArray>_>::pop(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  index = &(this->super_Parser).index;
LAB_00140833:
  (this->super_Parser).index = lVar13 + 1;
  TVar3 = (this->super_Parser).symbols.d.ptr[lVar13].token;
  switch(TVar3) {
  case NEWLINE:
    break;
  case PP_WHITESPACE:
  case BACKSLASH:
  case INCOMPLETE:
  case PP_HASHHASH:
switchD_00140867_caseD_a5:
    QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
              ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,
               (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
    QList<Symbol>::end(preprocessed);
    break;
  case PP_DEFINE:
    if (*index < lVar11) {
      *index = *index + 1;
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    pSVar15 = (this->super_Parser).symbols.d.ptr;
    lVar11 = (this->super_Parser).index;
    QByteArray::mid(&local_58,&pSVar15[lVar11 + -1].lex,pSVar15[lVar11 + -1].from,
                    pSVar15[lVar11 + -1].len);
    if ((Symbol *)local_58.d.size == (Symbol *)0x0) {
LAB_00141672:
      Parser::error(&this->super_Parser,(char *)0x0);
    }
    if (((Symbol *)local_58.d.d == (Symbol *)0x0) ||
       (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(&local_58,local_58.d.size,KeepSize);
    }
    bVar2 = (byte)(((QArrayData *)local_58.d.ptr)->ref_)._q_value.super___atomic_base<int>._M_i;
    if (((0x19 < (int)(char)(bVar2 & 0xdf) - 0x41U) && (bVar2 != 0x24)) && (bVar2 != 0x5f))
    goto LAB_00141672;
    local_d8.symbols.d.ptr = (Symbol *)0x0;
    local_d8.symbols.d.size = 0;
    local_d8.arguments.d.size = 0;
    local_d8.symbols.d.d = (Data *)0x0;
    local_d8.arguments.d.d = (Data *)0x0;
    local_d8.arguments.d.ptr = (Symbol *)0x0;
    lVar11 = (this->super_Parser).index;
    if ((lVar11 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar11].token == LPAREN)) {
      (this->super_Parser).index = lVar11 + 1;
      local_d8._0_8_ = (Data *)0xaaaaaaaaaaaa0001;
      parseDefineArguments(this,&local_d8);
    }
    else {
      local_d8._0_8_ = (Data *)0xaaaaaaaaaaaa0000;
    }
    uVar18 = (this->super_Parser).index;
    lVar11 = (this->super_Parser).symbols.d.size;
    lVar13 = uVar18 * 0x30;
    pTVar14 = &(this->super_Parser).symbols.d.ptr[uVar18].token;
    uVar16 = uVar18;
    do {
      if (lVar11 <= (long)uVar16) break;
      uVar16 = uVar16 + 1;
      *index = uVar16;
      TVar3 = *pTVar14;
      pTVar14 = pTVar14 + 0xc;
    } while (TVar3 != NEWLINE);
    QList<Symbol>::reserve(&local_d8.symbols,~uVar18 + *index);
    if ((long)uVar18 < *index + -1) {
      iVar9 = 0x9e;
      do {
        iVar10 = *(int *)((long)&((this->super_Parser).symbols.d.ptr)->token + lVar13);
        if (iVar10 == 0xb1) {
          if ((local_d8.symbols.d.size != 0) && (iVar9 == 0xa5)) {
            QList<Symbol>::pop_back(&local_d8.symbols);
          }
LAB_00140ea4:
          QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                    ((QMovableArrayOps<Symbol> *)&local_d8.symbols,local_d8.symbols.d.size,
                     (Symbol *)((long)&((this->super_Parser).symbols.d.ptr)->lineNum + lVar13));
          QList<Symbol>::end(&local_d8.symbols);
          iVar9 = iVar10;
        }
        else if (((iVar10 != 0xa5) || (0x14 < iVar9 - 0x9eU)) ||
                ((0x180081U >> (iVar9 - 0x9eU & 0x1f) & 1) == 0)) goto LAB_00140ea4;
        uVar18 = uVar18 + 1;
        lVar13 = lVar13 + 0x30;
      } while ((long)uVar18 < *index + -1);
    }
    while (local_d8.symbols.d.size != 0) {
      if ((((ArrayOptions *)&local_d8.symbols.d.ptr[local_d8.symbols.d.size + -1].token)->
          super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
          super_QFlagsStorage<QArrayData::ArrayOption>.i != 0xa5) {
        if ((local_d8.symbols.d.size != 0) &&
           (((((ArrayOptions *)&(local_d8.symbols.d.ptr)->token)->
             super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
             super_QFlagsStorage<QArrayData::ArrayOption>.i == 0xb1 ||
            ((((ArrayOptions *)&local_d8.symbols.d.ptr[local_d8.symbols.d.size + -1].token)->
             super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
             super_QFlagsStorage<QArrayData::ArrayOption>.i == 0xb1)))) {
          Parser::error(&this->super_Parser,
                        "\'##\' cannot appear at either end of a macro expansion");
        }
        break;
      }
      QList<Symbol>::pop_back(&local_d8.symbols);
    }
    if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&((Symbol *)local_58.d.d)->lineNum)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&((Symbol *)local_58.d.d)->lineNum)->_q_value).
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108.from = 0;
    local_108.array.d.d = local_58.d.d;
    local_108.array.d.ptr = local_58.d.ptr;
    local_108.array.d.size = local_58.d.size;
    local_108.len = local_58.d.size;
    QHash<SubArray,Macro>::emplace<Macro_const&>
              ((QHash<SubArray,Macro> *)&this->macros,&local_108,&local_d8);
    if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
      LOCK();
      ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_108.array.d.d)->super_QArrayData,1,0x10);
      }
    }
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_d8.symbols.d);
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_d8.arguments.d);
    if ((Symbol *)local_58.d.d == (Symbol *)0x0) break;
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pSVar15 = (Symbol *)local_58.d.d;
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) break;
    goto LAB_00141623;
  case PP_UNDEF:
    if (*index < lVar11) {
      *index = *index + 1;
    }
    local_108.array.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.array.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.array.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    pSVar15 = (this->super_Parser).symbols.d.ptr;
    lVar11 = (this->super_Parser).index;
    QByteArray::mid(&local_108.array,&pSVar15[lVar11 + -1].lex,pSVar15[lVar11 + -1].from,
                    pSVar15[lVar11 + -1].len);
    lVar11 = (this->super_Parser).symbols.d.size;
    lVar13 = (this->super_Parser).index;
    pTVar14 = &(this->super_Parser).symbols.d.ptr[lVar13].token;
    do {
      if (lVar11 <= lVar13) break;
      lVar13 = lVar13 + 1;
      *index = lVar13;
      TVar3 = *pTVar14;
      pTVar14 = pTVar14 + 0xc;
    } while (TVar3 != NEWLINE);
    local_d8._0_8_ = local_108.array.d.d;
    local_d8.arguments.d.d = (Data *)local_108.array.d.ptr;
    local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.size;
    if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
      LOCK();
      ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    local_d8.arguments.d.size = 0;
    local_d8.symbols.d.d = (Data *)local_108.array.d.size;
    QHash<SubArray,_Macro>::removeImpl<SubArray>(&this->macros,(SubArray *)&local_d8);
    if ((Data *)local_d8._0_8_ != (Data *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
      }
    }
    goto LAB_0014160f;
  case PP_IF:
  case PP_IFDEF:
  case PP_IFNDEF:
    while ((iVar9 = evaluateCondition(this), iVar9 == 0 && (bVar20 = skipBranch(this), bVar20))) {
      lVar11 = (this->super_Parser).symbols.d.size;
      lVar13 = (this->super_Parser).index;
      if ((lVar11 <= lVar13) || ((this->super_Parser).symbols.d.ptr[lVar13].token != PP_ELIF)) {
        lVar13 = (this->super_Parser).index;
        pTVar14 = &(this->super_Parser).symbols.d.ptr[lVar13].token;
        goto LAB_00140f5b;
      }
      (this->super_Parser).index = lVar13 + 1;
    }
    break;
  case PP_ELIF:
  case PP_ELSE:
    skipUntilEndif(this);
  case PP_ENDIF:
    lVar11 = (this->super_Parser).symbols.d.size;
    lVar13 = (this->super_Parser).index;
    pTVar14 = &(this->super_Parser).symbols.d.ptr[lVar13].token;
    do {
      if (lVar11 <= lVar13) break;
      lVar13 = lVar13 + 1;
      *index = lVar13;
      TVar3 = *pTVar14;
      pTVar14 = pTVar14 + 0xc;
    } while (TVar3 != NEWLINE);
    break;
  case PP_INCLUDE:
    pSVar15 = (this->super_Parser).symbols.d.ptr;
    lVar13 = (this->super_Parser).index;
    iVar9 = pSVar15[lVar13 + -1].lineNum;
    local_108.array.d.d = (Data *)0x0;
    local_108.array.d.ptr = (char *)0x0;
    local_108.array.d.size = 0;
    if ((lVar13 < lVar11) && (pSVar15[lVar13].token == PP_STRING_LITERAL)) {
      *index = lVar13 + 1;
      QByteArray::mid((QByteArray *)&local_d8,&pSVar15[lVar13].lex,pSVar15[lVar13].from,
                      pSVar15[lVar13].len);
      if (local_d8.arguments.d.ptr == (Symbol *)0x0) {
        bVar20 = false;
      }
      else {
        bVar20 = (char)((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i == '\"';
      }
      if ((Data *)local_d8._0_8_ != (Data *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
        }
      }
      pSVar15 = (this->super_Parser).symbols.d.ptr;
      lVar11 = (this->super_Parser).index;
      QByteArray::mid((QByteArray *)&local_d8,&pSVar15[lVar11 + -1].lex,
                      pSVar15[lVar11 + -1].from + 1,pSVar15[lVar11 + -1].len + -2);
      pSVar15 = local_d8.arguments.d.ptr;
      uVar6 = local_d8._0_8_;
      pcVar17 = local_108.array.d.ptr;
      pDVar5 = local_108.array.d.d;
      local_d8._0_8_ = local_108.array.d.d;
      local_108.array.d.d = (Data *)uVar6;
      local_108.array.d.ptr = (char *)local_d8.arguments.d.d;
      local_d8.arguments.d.d = (Data *)pcVar17;
      local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.size;
      local_108.array.d.size = (qsizetype)pSVar15;
      if ((Symbol *)pDVar5 != (Symbol *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
        }
      }
      lVar11 = (this->super_Parser).symbols.d.size;
      lVar13 = (this->super_Parser).index;
      pTVar14 = &(this->super_Parser).symbols.d.ptr[lVar13].token;
      do {
        if (lVar11 <= lVar13) break;
        lVar13 = lVar13 + 1;
        *index = lVar13;
        TVar3 = *pTVar14;
        pTVar14 = pTVar14 + 0xc;
      } while (TVar3 != NEWLINE);
      if (bVar20) {
        local_58.d.d = (filename->d).d;
        local_58.d.ptr = (filename->d).ptr;
        local_58.d.size = (filename->d).size;
        if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
          LOCK();
          (((QArrayData *)&((Symbol *)local_58.d.d)->lineNum)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((Symbol *)local_58.d.d)->lineNum)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char *)0x0;
        local_58.d.size = 0;
      }
      resolveInclude((QByteArray *)&local_d8,this,&local_108.array,&local_58);
      pSVar15 = local_d8.arguments.d.ptr;
      uVar6 = local_d8._0_8_;
      pcVar17 = local_108.array.d.ptr;
      pDVar5 = local_108.array.d.d;
      local_d8._0_8_ = local_108.array.d.d;
      local_108.array.d.d = (Data *)uVar6;
      local_108.array.d.ptr = (char *)local_d8.arguments.d.d;
      local_d8.arguments.d.d = (Data *)pcVar17;
      local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.size;
      local_108.array.d.size = (qsizetype)pSVar15;
      if ((Data *)pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
        }
      }
      if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (((Symbol *)local_108.array.d.ptr != (Symbol *)0x0) &&
         ((this_02 = (this->preprocessedIncludes).q_hash.d,
          this_02 == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0 ||
          (pNVar12 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                     findNode<QByteArray>(this_02,&local_108.array),
          pNVar12 == (Node<QByteArray,_QHashDummyValue> *)0x0)))) {
        QHash<QByteArray,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QByteArray,QHashDummyValue> *)&this->preprocessedIncludes,&local_108.array
                   ,(QHashDummyValue *)&local_d8);
        local_68.super_QFileDevice.super_QIODevice._vptr_QIODevice =
             (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
        local_68.super_QFileDevice.super_QIODevice.d_ptr._M_t.
        super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
        super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
        super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
             (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
             &DAT_aaaaaaaaaaaaaaaa;
        pcVar17 = local_108.array.d.ptr;
        if ((Symbol *)local_108.array.d.ptr == (Symbol *)0x0) {
          pcVar17 = "";
        }
        this_03 = (QString *)0xffffffffffffffff;
        do {
          pcVar1 = (char *)((long)&(((QArrayData *)&((Symbol *)pcVar17)->lineNum)->ref_)._q_value.
                                   super___atomic_base<int>._M_i + 1) + (long)this_03;
          this_03 = (QString *)((long)&(this_03->d).d + 1);
        } while (*pcVar1 != '\0');
        ba.m_data = (storage_type *)pSVar15;
        ba.m_size = (qsizetype)pcVar17;
        QString::fromLocal8Bit((QString *)&local_d8,this_03,ba);
        QFile::QFile(&local_68,(QString *)&local_d8);
        iVar10 = extraout_EDX;
        if ((Data *)local_d8._0_8_ != (Data *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
            iVar10 = extraout_EDX_00;
          }
        }
        iVar10 = QFile::open(&local_68,(char *)0x1,iVar10);
        if ((char)iVar10 != '\0') {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          pQVar19 = &local_68;
          readOrMapFile(&local_58,&local_68);
          QFileDevice::close(&local_68.super_QFileDevice,(int)pQVar19);
          if ((Symbol *)local_58.d.size != (Symbol *)0x0) {
            local_88.d = (this->super_Parser).symbols.d.d;
            local_88.ptr = (this->super_Parser).symbols.d.ptr;
            local_88.size = (this->super_Parser).symbols.d.size;
            if (local_88.d != (Data *)0x0) {
              LOCK();
              ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            qVar4 = *index;
            cleaned((QByteArray *)&local_d8,&local_58);
            pcVar17 = local_58.d.ptr;
            pDVar5 = local_58.d.d;
            pSVar15 = local_d8.arguments.d.ptr;
            uVar6 = local_d8._0_8_;
            local_d8._0_8_ = local_58.d.d;
            local_58.d.d = (Data *)uVar6;
            local_58.d.ptr = (char *)local_d8.arguments.d.d;
            local_d8.arguments.d.d = (Data *)pcVar17;
            local_d8.arguments.d.ptr = (Symbol *)local_58.d.size;
            local_58.d.size = (qsizetype)pSVar15;
            if ((Symbol *)pDVar5 != (Symbol *)0x0) {
              LOCK();
              (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
              }
            }
            tokenize((Symbols *)&local_a0,&local_58,1,TokenizeCpp);
            qVar8 = local_a0.size;
            pSVar15 = local_a0.ptr;
            pDVar7 = local_a0.d;
            local_a0.d = (Data *)0x0;
            local_a0.ptr = (Symbol *)0x0;
            local_a0.size = 0;
            local_d8._0_8_ = (this->super_Parser).symbols.d.d;
            local_d8.arguments.d.d = (Data *)(this->super_Parser).symbols.d.ptr;
            (this->super_Parser).symbols.d.d = pDVar7;
            (this->super_Parser).symbols.d.ptr = pSVar15;
            local_d8.arguments.d.ptr = (Symbol *)(this->super_Parser).symbols.d.size;
            (this->super_Parser).symbols.d.size = qVar8;
            QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_d8);
            QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_a0);
            QByteArray::clear(&local_58);
            (this->super_Parser).index = 0;
            local_d8._0_8_ = (Data *)0x9900000000;
            local_d8.arguments.d.d = (Data *)local_108.array.d.d;
            local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.ptr;
            local_d8.arguments.d.size = local_108.array.d.size;
            if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
              LOCK();
              ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   = ((local_108.array.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_d8.symbols.d.d = (Data *)0x0;
            local_d8.symbols.d.ptr = (Symbol *)local_108.array.d.size;
            QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                      ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,
                       (Symbol *)&local_d8);
            QList<Symbol>::end(preprocessed);
            if ((Symbol *)local_d8.arguments.d.d != (Symbol *)0x0) {
              LOCK();
              ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_d8.arguments.d.d)->super_QArrayData,1,0x10);
              }
            }
            preprocess(this,&local_108.array,preprocessed);
            local_d8._4_4_ = 0x9a;
            local_d8._0_4_ = iVar9;
            local_d8.arguments.d.d = (Data *)local_108.array.d.d;
            local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.ptr;
            local_d8.arguments.d.size = local_108.array.d.size;
            if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
              LOCK();
              ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   = ((local_108.array.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_d8.symbols.d.d = (Data *)0x0;
            local_d8.symbols.d.ptr = (Symbol *)local_108.array.d.size;
            QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                      ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,
                       (Symbol *)&local_d8);
            QList<Symbol>::end(preprocessed);
            if ((Symbol *)local_d8.arguments.d.d != (Symbol *)0x0) {
              LOCK();
              ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_d8.arguments.d.d)->super_QArrayData,1,0x10);
              }
            }
            QArrayDataPointer<Symbol>::operator=((QArrayDataPointer<Symbol> *)this,&local_88);
            (this->super_Parser).index = qVar4;
            QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_88);
          }
          if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        QFile::~QFile(&local_68);
      }
    }
LAB_0014160f:
    if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
      LOCK();
      ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      iVar9 = ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pSVar15 = (Symbol *)local_108.array.d.d;
joined_r0x00140dd9:
      if (iVar9 == 0) {
LAB_00141623:
        QArrayData::deallocate((QArrayData *)pSVar15,1,0x10);
      }
    }
    break;
  case PP_HASH:
    lVar13 = (this->super_Parser).index;
    pTVar14 = &(this->super_Parser).symbols.d.ptr[lVar13].token;
    do {
      if (lVar11 <= lVar13) break;
      lVar13 = lVar13 + 1;
      *index = lVar13;
      TVar3 = *pTVar14;
      pTVar14 = pTVar14 + 0xc;
    } while (TVar3 != NEWLINE);
    break;
  default:
    if (1 < TVar3 - SIGNALS) {
      if (TVar3 != IDENTIFIER) goto switchD_00140867_caseD_a5;
      local_d8._0_8_ = (Data *)0x0;
      macroExpand(preprocessed,this,(Symbols *)this,index,
                  (this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum,true,
                  (QSet<QByteArray> *)&local_d8);
      QHash<QByteArray,_QHashDummyValue>::~QHash((QHash<QByteArray,_QHashDummyValue> *)&local_d8);
      break;
    }
    pSVar15 = (this->super_Parser).symbols.d.ptr;
    lVar11 = (this->super_Parser).index;
    local_d8._0_8_ = *(undefined8 *)(pSVar15 + lVar11 + -1);
    local_d8.arguments.d.d = (Data *)pSVar15[lVar11 + -1].lex.d.d;
    local_d8.arguments.d.ptr = (Symbol *)pSVar15[lVar11 + -1].lex.d.ptr;
    local_d8.arguments.d.size = pSVar15[lVar11 + -1].lex.d.size;
    if ((Symbol *)local_d8.arguments.d.d != (Symbol *)0x0) {
      LOCK();
      (((QArrayData *)&((Symbol *)local_d8.arguments.d.d)->lineNum)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((Symbol *)local_d8.arguments.d.d)->lineNum)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d8.symbols.d.d = (Data *)pSVar15[lVar11 + -1].from;
    local_d8.symbols.d.ptr = (Symbol *)pSVar15[lVar11 + -1].len;
    QByteArray::QByteArray(&local_108.array,"QT_NO_KEYWORDS",-1);
    local_108.from = 0;
    local_108.len = local_108.array.d.size;
    this_01 = (this->macros).d;
    if (this_01 == (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) {
LAB_00140a5b:
      bVar20 = false;
    }
    else {
      BVar21 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
                         (this_01,&local_108);
      if ((BVar21.span)->offsets[BVar21.index] == 0xff) goto LAB_00140a5b;
      bVar20 = (BVar21.span)->entries != (Entry *)0x0;
    }
    if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
      LOCK();
      ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_108.array.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (bVar20) {
      local_d8._4_4_ = 1;
    }
    else {
      local_d8._0_8_ = (ulong)CONCAT14(TVar3 == SIGNALS,local_d8._0_4_) ^ 0x8b00000000;
    }
    QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
              ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,(Symbol *)&local_d8);
    QList<Symbol>::end(preprocessed);
    if ((Symbol *)local_d8.arguments.d.d == (Symbol *)0x0) break;
    LOCK();
    ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    iVar9 = ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
    ;
    UNLOCK();
    pSVar15 = (Symbol *)local_d8.arguments.d.d;
    goto joined_r0x00140dd9;
  }
  goto switchD_00140867_caseD_a4;
  while( true ) {
    lVar13 = lVar13 + 1;
    *index = lVar13;
    TVar3 = *pTVar14;
    pTVar14 = pTVar14 + 0xc;
    if (TVar3 == NEWLINE) break;
LAB_00140f5b:
    if (lVar11 <= lVar13) break;
  }
switchD_00140867_caseD_a4:
  lVar11 = (this->super_Parser).symbols.d.size;
  lVar13 = (this->super_Parser).index;
  if (lVar11 <= lVar13) goto LAB_00141643;
  goto LAB_00140833;
}

Assistant:

void Preprocessor::preprocess(const QByteArray &filename, Symbols &preprocessed)
{
    currentFilenames.push(filename);
    preprocessed.reserve(preprocessed.size() + symbols.size());
    while (hasNext()) {
        Token token = next();

        switch (token) {
        case PP_INCLUDE:
        {
            int lineNum = symbol().lineNum;
            QByteArray include;
            bool local = false;
            if (test(PP_STRING_LITERAL)) {
                local = lexem().startsWith('\"');
                include = unquotedLexem();
            } else
                continue;
            until(PP_NEWLINE);

            include = resolveInclude(include, local ? filename : QByteArray());
            if (include.isNull())
                continue;

            if (Preprocessor::preprocessedIncludes.contains(include))
                continue;
            Preprocessor::preprocessedIncludes.insert(include);

            QFile file(QString::fromLocal8Bit(include.constData()));
            if (!file.open(QFile::ReadOnly))
                continue;

            QByteArray input = readOrMapFile(&file);

            file.close();
            if (input.isEmpty())
                continue;

            Symbols saveSymbols = symbols;
            qsizetype saveIndex = index;

            // phase 1: get rid of backslash-newlines
            input = cleaned(input);

            // phase 2: tokenize for the preprocessor
            symbols = tokenize(input);
            input.clear();

            index = 0;

            // phase 3: preprocess conditions and substitute macros
            preprocessed += Symbol(0, MOC_INCLUDE_BEGIN, include);
            preprocess(include, preprocessed);
            preprocessed += Symbol(lineNum, MOC_INCLUDE_END, include);

            symbols = saveSymbols;
            index = saveIndex;
            continue;
        }
        case PP_DEFINE:
        {
            next();
            QByteArray name = lexem();
            if (name.isEmpty() || !is_ident_start(name[0]))
                error();
            Macro macro;
            macro.isVariadic = false;
            if (test(LPAREN)) {
                // we have a function macro
                macro.isFunction = true;
                parseDefineArguments(&macro);
            } else {
                macro.isFunction = false;
            }
            qsizetype start = index;
            until(PP_NEWLINE);
            macro.symbols.reserve(index - start - 1);

            // remove whitespace where there shouldn't be any:
            // Before and after the macro, after a # and around ##
            Token lastToken = HASH; // skip shitespace at the beginning
            for (qsizetype i = start; i < index - 1; ++i) {
                Token token = symbols.at(i).token;
                if (token == WHITESPACE) {
                    if (lastToken == PP_HASH || lastToken == HASH ||
                        lastToken == PP_HASHHASH ||
                        lastToken == WHITESPACE)
                        continue;
                } else if (token == PP_HASHHASH) {
                    if (!macro.symbols.isEmpty() &&
                        lastToken == WHITESPACE)
                        macro.symbols.pop_back();
                }
                macro.symbols.append(symbols.at(i));
                lastToken = token;
            }
            // remove trailing whitespace
            while (!macro.symbols.isEmpty() &&
                   (macro.symbols.constLast().token == PP_WHITESPACE || macro.symbols.constLast().token == WHITESPACE))
                macro.symbols.pop_back();

            if (!macro.symbols.isEmpty()) {
                if (macro.symbols.constFirst().token == PP_HASHHASH ||
                    macro.symbols.constLast().token == PP_HASHHASH) {
                    error("'##' cannot appear at either end of a macro expansion");
                }
            }
            macros.insert(name, macro);
            continue;
        }
        case PP_UNDEF: {
            next();
            QByteArray name = lexem();
            until(PP_NEWLINE);
            macros.remove(name);
            continue;
        }
        case PP_IDENTIFIER: {
            // substitute macros
            macroExpand(&preprocessed, this, symbols, index, symbol().lineNum, true);
            continue;
        }
        case PP_HASH:
            until(PP_NEWLINE);
            continue; // skip unknown preprocessor statement
        case PP_IFDEF:
        case PP_IFNDEF:
        case PP_IF:
            while (!evaluateCondition()) {
                if (!skipBranch())
                    break;
                if (test(PP_ELIF)) {
                } else {
                    until(PP_NEWLINE);
                    break;
                }
            }
            continue;
        case PP_ELIF:
        case PP_ELSE:
            skipUntilEndif();
            Q_FALLTHROUGH();
        case PP_ENDIF:
            until(PP_NEWLINE);
            continue;
        case PP_NEWLINE:
            continue;
        case SIGNALS:
        case SLOTS: {
            Symbol sym = symbol();
            if (macros.contains("QT_NO_KEYWORDS"))
                sym.token = IDENTIFIER;
            else
                sym.token = (token == SIGNALS ? Q_SIGNALS_TOKEN : Q_SLOTS_TOKEN);
            preprocessed += sym;
        } continue;
        default:
            break;
        }
        preprocessed += symbol();
    }

    currentFilenames.pop();
}